

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<wasm::(anonymous_namespace)::
GlobalStructInference::run(wasm::Module*)::GlobalToUnnest,std::allocator<wasm::(anonymous_namespace)
::GlobalStructInference::run(wasm::Module*)::GlobalToUnnest>>,(wasm::Mutability)0,wasm::ModuleUtils
::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,std::vector<wasm::(anonymous_namespace)
::GlobalStructInference::run(wasm::Module*)::GlobalToUnnest,std::allocator<wasm::
(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::GlobalToUnnest>>&)>)::Mapper::
doWalkFunction(wasm::Function__(void *this,Function *curr)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
  *this_00;
  _Base_ptr p_Var2;
  _Link_type __z;
  const_iterator __x;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  const_iterator __position;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar5;
  Function *local_38;
  
  this_00 = *(_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
              **)((long)this + 0x138);
  p_Var2 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this_00->_M_impl).super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    p_Var4 = p_Var2;
    do {
      if (*(Function **)(p_Var4 + 1) >= curr) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(Function **)(p_Var4 + 1) < curr];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
       (__position._M_node = &p_Var1->_M_header, *(Function **)(p_Var3 + 1) <= curr)) {
      do {
        if (*(Function **)(p_Var2 + 1) >= curr) {
          __position._M_node = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[*(Function **)(p_Var2 + 1) < curr];
      } while (p_Var2 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)__position._M_node == p_Var1) ||
         (__x._M_node = __position._M_node, curr < *(Function **)(__position._M_node + 1))) {
        __z = (_Link_type)operator_new(0x40);
        *(Function **)(__z->_M_storage)._M_storage = curr;
        (__z->_M_storage)._M_storage[8] = '\0';
        (__z->_M_storage)._M_storage[9] = '\0';
        (__z->_M_storage)._M_storage[10] = '\0';
        (__z->_M_storage)._M_storage[0xb] = '\0';
        (__z->_M_storage)._M_storage[0xc] = '\0';
        (__z->_M_storage)._M_storage[0xd] = '\0';
        (__z->_M_storage)._M_storage[0xe] = '\0';
        (__z->_M_storage)._M_storage[0xf] = '\0';
        (__z->_M_storage)._M_storage[0x10] = '\0';
        (__z->_M_storage)._M_storage[0x11] = '\0';
        (__z->_M_storage)._M_storage[0x12] = '\0';
        (__z->_M_storage)._M_storage[0x13] = '\0';
        (__z->_M_storage)._M_storage[0x14] = '\0';
        (__z->_M_storage)._M_storage[0x15] = '\0';
        (__z->_M_storage)._M_storage[0x16] = '\0';
        (__z->_M_storage)._M_storage[0x17] = '\0';
        (__z->_M_storage)._M_storage[0x18] = '\0';
        (__z->_M_storage)._M_storage[0x19] = '\0';
        (__z->_M_storage)._M_storage[0x1a] = '\0';
        (__z->_M_storage)._M_storage[0x1b] = '\0';
        (__z->_M_storage)._M_storage[0x1c] = '\0';
        (__z->_M_storage)._M_storage[0x1d] = '\0';
        (__z->_M_storage)._M_storage[0x1e] = '\0';
        (__z->_M_storage)._M_storage[0x1f] = '\0';
        pVar5 = std::
                _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
                ::_M_get_insert_hint_unique_pos(this_00,__position,(key_type *)curr);
        __x._M_node = pVar5.first;
        if (pVar5.second == (_Base_ptr)0x0) {
          std::
          _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
          ::_M_drop_node((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
                          *)__z,(_Link_type)__position._M_node);
        }
        else {
          std::
          _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
          ::_M_insert_node(this_00,__x._M_node,pVar5.second,__z);
          __x._M_node = (_Base_ptr)__z;
        }
      }
      local_38 = curr;
      if (*(long *)((long)this + 0x150) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)((long)this + 0x158))
                ((long)this + 0x140,&local_38,(((_Link_type)__x._M_node)->_M_storage)._M_storage + 8
                );
      return;
    }
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x13e,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<GlobalToUnnest>>::doAnalysis(Func)::Mapper::doWalkFunction(Function *) [T = std::vector<GlobalToUnnest>, Mut = wasm::Immutable, MapT = wasm::ModuleUtils::DefaultMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }